

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::stopRecordingAudio(QSynth *this)

{
  bool bVar1;
  int __fd;
  undefined1 local_20 [8];
  QMutexLocker<QMutex> synthLocker;
  QSynth *this_local;
  QMutex *mutex;
  
  mutex = this->synthMutex;
  synthLocker._8_8_ = this;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_20,mutex);
  __fd = (int)mutex;
  bVar1 = isRecordingAudio(this);
  if (bVar1) {
    AudioFileWriter::close(this->audioRecorder,__fd);
    if (this->audioRecorder != (AudioFileWriter *)0x0) {
      (*this->audioRecorder->_vptr_AudioFileWriter[1])();
    }
    this->audioRecorder = (AudioFileWriter *)0x0;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_20);
  return;
}

Assistant:

void QSynth::stopRecordingAudio() {
	QMutexLocker synthLocker(synthMutex);
	if (!isRecordingAudio()) return;
	audioRecorder->close();
	delete audioRecorder;
	audioRecorder = NULL;
}